

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAdda<(moira::Instr)2,(moira::Mode)4,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)4,_4> src;
  u32 local_34;
  ushort local_30;
  
  local_30 = op & 7;
  local_34 = *addr;
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)4,_4> *)&local_34);
  StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(An)((op & 0xe00) >> 9));
  return;
}

Assistant:

void
Moira::dasmAdda(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = An       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}